

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.h
# Opt level: O0

void __thiscall lexer_exception::~lexer_exception(lexer_exception *this)

{
  lexer_exception *this_local;
  
  ~lexer_exception(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~lexer_exception() throw() { }